

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O3

string * __thiscall
cmNinjaNormalTargetGenerator::LanguageLinkerRule
          (string *__return_storage_ptr__,cmNinjaNormalTargetGenerator *this,string *config)

{
  TargetType targetType;
  string *psVar1;
  string *name;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_110;
  string local_f0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_d0;
  undefined8 local_b8;
  char *local_b0;
  undefined8 local_a8;
  size_type local_a0;
  pointer local_98;
  undefined8 local_90;
  undefined8 local_88;
  char *local_80;
  undefined8 local_78;
  size_type local_70;
  pointer local_68;
  string *local_60;
  undefined8 local_58;
  char *local_50;
  undefined8 local_48;
  size_type local_40;
  pointer local_38;
  undefined8 local_30;
  
  cmGeneratorTarget::GetLinkerLanguage
            (&local_f0,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  targetType = cmGeneratorTarget::GetType
                         ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget);
  psVar1 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
  name = cmGeneratorTarget::GetName_abi_cxx11_
                   ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                    GeneratorTarget);
  cmGlobalNinjaGenerator::EncodeRuleName(&local_110,name);
  local_d0.first._M_len = local_f0._M_string_length;
  local_d0.first._M_str = local_f0._M_dataplus._M_p;
  local_b8 = 1;
  local_b0 = "_";
  local_a8 = 0;
  local_98 = (psVar1->_M_dataplus)._M_p;
  local_a0 = psVar1->_M_string_length;
  local_90 = 0;
  local_88 = 9;
  local_80 = "_LINKER__";
  local_78 = 0;
  local_70 = local_110._M_string_length;
  local_68 = local_110._M_dataplus._M_p;
  local_58 = 1;
  local_50 = "_";
  local_48 = 0;
  local_38 = (config->_M_dataplus)._M_p;
  local_40 = config->_M_string_length;
  local_30 = 0;
  views._M_len = 7;
  views._M_array = &local_d0;
  local_d0.second = &local_f0;
  local_60 = &local_110;
  cmCatViews(__return_storage_ptr__,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaNormalTargetGenerator::LanguageLinkerRule(
  const std::string& config) const
{
  return cmStrCat(
    this->TargetLinkLanguage(config), "_",
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType()),
    "_LINKER__",
    cmGlobalNinjaGenerator::EncodeRuleName(
      this->GetGeneratorTarget()->GetName()),
    "_", config);
}